

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

iterator * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::last(iterator *this)

{
  bool bVar1;
  node_ptr node;
  iterator *this_local;
  
  invalidate(this);
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==
                    (&this->db_->root,(nullptr_t)0x0);
  this_local = this;
  if (!bVar1) {
    this_local = right_most_traversal(this,(node_ptr)(this->db_->root).tagged_ptr);
  }
  return this_local;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::last() {
  invalidate();  // clear the stack
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // empty tree.
  const auto node{db_.root};
  return right_most_traversal(node);
}